

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

bool __thiscall
gl4cts::GPUShaderFP64Test10::verifyResults
          (GPUShaderFP64Test10 *this,functionObject *function_object,GLuint vertex)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  uint uVar5;
  _variable_type type;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  TestContext *pTVar7;
  TestLog *pTVar8;
  MessageBuilder *pMVar9;
  reference buffer;
  MessageBuilder local_538;
  reference local_3b8;
  GLubyte *argument_src;
  GLuint argument_offset;
  GLuint argument;
  GLvoid *result_src_1;
  GLvoid *expected_result_src_1;
  _variable_type local_390;
  GLuint result_offset_1;
  _variable_type result_type_1;
  GLuint result_1;
  MessageBuilder local_380;
  MessageBuilder local_1f0;
  int local_70;
  GLuint local_6c;
  GLuint arguments_offset;
  GLuint argument_stride;
  GLvoid *result_src;
  GLvoid *expected_result_src;
  _variable_type local_50;
  GLuint result_offset;
  _variable_type result_type;
  GLuint result;
  GLubyte *feedback_data;
  GLubyte *expected_results;
  GLuint results_offset;
  GLuint results_stride;
  GLuint n_results;
  bool test_result;
  Functions *gl;
  functionObject *pfStack_18;
  GLuint vertex_local;
  functionObject *function_object_local;
  GPUShaderFP64Test10 *this_local;
  
  gl._4_4_ = vertex;
  pfStack_18 = function_object;
  function_object_local = (functionObject *)this;
  pRVar6 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar6->_vptr_RenderContext[3])();
  _n_results = CONCAT44(extraout_var,iVar3);
  results_stride._3_1_ = 1;
  results_offset = (*pfStack_18->_vptr_functionObject[5])();
  expected_results._4_4_ = functionObject::getResultStride(pfStack_18);
  expected_results._0_4_ = gl._4_4_ * expected_results._4_4_;
  feedback_data =
       std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                 (&this->m_expected_results_data,(ulong)(uint)expected_results);
  (**(code **)(_n_results + 0x40))(0x8c8e,this->m_transform_feedback_buffer_id);
  dVar4 = (**(code **)(_n_results + 0x800))();
  glu::checkError(dVar4,"BindBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x3ba2);
  _result_type = (**(code **)(_n_results + 0xcf8))(0x8c8e,35000);
  dVar4 = (**(code **)(_n_results + 0x800))();
  glu::checkError(dVar4,"MapBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x3ba5);
  result_offset = 0;
  do {
    if (results_offset <= result_offset) {
LAB_00fb67d2:
      (**(code **)(_n_results + 0x1670))(0x8c8e);
      dVar4 = (**(code **)(_n_results + 0x800))();
      glu::checkError(dVar4,"UnmapBuffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                      ,0x3bb8);
      if ((results_stride._3_1_ & 1) == 0) {
        local_6c = functionObject::getArgumentStride(pfStack_18);
        local_70 = gl._4_4_ * local_6c;
        pTVar7 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        pTVar8 = tcu::TestContext::getLog(pTVar7);
        tcu::TestLog::operator<<(&local_1f0,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar9 = tcu::MessageBuilder::operator<<(&local_1f0,(char (*) [23])"Error. Invalid result.")
        ;
        tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1f0);
        pTVar7 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        pTVar8 = tcu::TestContext::getLog(pTVar7);
        tcu::TestLog::operator<<(&local_380,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar9 = tcu::MessageBuilder::operator<<(&local_380,(char (*) [11])0x29af9ad);
        _result_type_1 = functionObject::getName(pfStack_18);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char **)&result_type_1);
        tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_380);
        for (result_offset_1 = 0; result_offset_1 < results_offset;
            result_offset_1 = result_offset_1 + 1) {
          local_390 = (*pfStack_18->_vptr_functionObject[6])(pfStack_18,(ulong)result_offset_1);
          expected_result_src_1._4_4_ = functionObject::getResultOffset(pfStack_18,result_offset_1);
          result_src_1 = feedback_data + expected_result_src_1._4_4_;
          _argument_offset = (GLvoid *)(_result_type + (ulong)expected_result_src_1._4_4_);
          logVariableType(this,_argument_offset,"Result",local_390);
          logVariableType(this,result_src_1,"Expected result",local_390);
        }
        argument_src._4_4_ = 0;
        while( true ) {
          uVar1 = argument_src._4_4_;
          uVar5 = (*pfStack_18->_vptr_functionObject[3])();
          if (uVar5 <= uVar1) break;
          argument_src._0_4_ = functionObject::getArgumentOffset(pfStack_18,argument_src._4_4_);
          buffer = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (&this->m_argument_data,(ulong)(local_70 + (GLuint)argument_src));
          local_3b8 = buffer;
          type = (*pfStack_18->_vptr_functionObject[4])(pfStack_18,(ulong)argument_src._4_4_);
          logVariableType(this,buffer,"Argument",type);
          argument_src._4_4_ = argument_src._4_4_ + 1;
        }
        pTVar7 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        pTVar8 = tcu::TestContext::getLog(pTVar7);
        tcu::TestLog::operator<<(&local_538,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar9 = tcu::MessageBuilder::operator<<(&local_538,(char (*) [9])0x2b155ca);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&this->m_vertex_shader_code);
        tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_538);
      }
      return (bool)(results_stride._3_1_ & 1);
    }
    local_50 = (*pfStack_18->_vptr_functionObject[6])(pfStack_18,(ulong)result_offset);
    expected_result_src._4_4_ = functionObject::getResultOffset(pfStack_18,result_offset);
    result_src = feedback_data + expected_result_src._4_4_;
    _arguments_offset = (GLvoid *)(_result_type + (ulong)expected_result_src._4_4_);
    bVar2 = compare(this,local_50,result_src,_arguments_offset);
    if (!bVar2) {
      results_stride._3_1_ = 0;
      goto LAB_00fb67d2;
    }
    result_offset = result_offset + 1;
  } while( true );
}

Assistant:

bool GPUShaderFP64Test10::verifyResults(const functionObject& function_object, glw::GLuint vertex)
{
	const glw::Functions& gl			   = m_context.getRenderContext().getFunctions();
	bool				  test_result	  = true;
	const glw::GLuint	 n_results		   = function_object.getResultCount();
	const glw::GLuint	 results_stride   = function_object.getResultStride();
	const glw::GLuint	 results_offset   = vertex * results_stride;
	const glw::GLubyte*   expected_results = &m_expected_results_data[results_offset];

	/* Get transform feedback data */
	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_transform_feedback_buffer_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindBuffer");

	glw::GLubyte* feedback_data = (glw::GLubyte*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "MapBuffer");

	for (glw::GLuint result = 0; result < n_results; ++result)
	{
		const Utils::_variable_type result_type   = function_object.getResultType(result);
		const glw::GLuint			result_offset = function_object.getResultOffset(result);

		const glw::GLvoid* expected_result_src = expected_results + result_offset;
		const glw::GLvoid* result_src		   = feedback_data + result_offset;

		if (false == compare(result_type, expected_result_src, result_src))
		{
			test_result = false;
			break;
		}
	}

	/* Unmap transform feedback buffer */
	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UnmapBuffer");

	if (false == test_result)
	{
		const glw::GLuint argument_stride  = function_object.getArgumentStride();
		const glw::GLuint arguments_offset = vertex * argument_stride;

		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Error. Invalid result."
											<< tcu::TestLog::EndMessage;

		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Function: " << function_object.getName()
											<< tcu::TestLog::EndMessage;

		for (glw::GLuint result = 0; result < n_results; ++result)
		{
			const Utils::_variable_type result_type   = function_object.getResultType(result);
			const glw::GLuint			result_offset = function_object.getResultOffset(result);

			const glw::GLvoid* expected_result_src = expected_results + result_offset;
			const glw::GLvoid* result_src		   = feedback_data + result_offset;

			logVariableType(result_src, "Result", result_type);
			logVariableType(expected_result_src, "Expected result", result_type);
		}

		for (glw::GLuint argument = 0; argument < function_object.getArgumentCount(); ++argument)
		{
			const glw::GLuint   argument_offset = function_object.getArgumentOffset(argument);
			const glw::GLubyte* argument_src	= &m_argument_data[arguments_offset + argument_offset];

			logVariableType(argument_src, "Argument", function_object.getArgumentType(argument));
		}

		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Shader:\n"
											<< m_vertex_shader_code << tcu::TestLog::EndMessage;
	}

	return test_result;
}